

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::SerializedShaderImpl> *this,
          RefCntAutoPtr<Diligent::SerializedShaderImpl> *AutoPtr)

{
  RefCntAutoPtr<Diligent::SerializedShaderImpl> *AutoPtr_local;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> *this_local;
  
  this->m_pObject = AutoPtr->m_pObject;
  if (this->m_pObject != (SerializedShaderImpl *)0x0) {
    RefCountedObject<Diligent::ISerializedShader>::AddRef
              ((RefCountedObject<Diligent::ISerializedShader> *)this->m_pObject);
  }
  return;
}

Assistant:

RefCntAutoPtr(const RefCntAutoPtr& AutoPtr) noexcept :
        m_pObject{AutoPtr.m_pObject}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }